

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O0

void __thiscall sfc::Image::~Image(Image *this)

{
  Image *this_local;
  
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            (&this->_colors);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->_palette);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->_indexed_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->_data);
  return;
}

Assistant:

Image(){}